

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::ReferenceContext::~ReferenceContext(ReferenceContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pfVar2;
  pointer pFVar3;
  pointer pGVar4;
  pointer pVVar5;
  pointer pcVar6;
  pointer ppDVar7;
  long lVar8;
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  vector<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_> local_28;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__ReferenceContext_00b4f460;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::VertexArray>::getAll
            (&this->m_vertexArrays,
             (vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)&local_28)
  ;
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteVertexArray(this,(VertexArray *)*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Texture>::getAll
            (&this->m_textures,
             (vector<sglr::rc::Texture_*,_std::allocator<sglr::rc::Texture_*>_> *)&local_28);
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteTexture(this,(Texture *)*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Framebuffer>::getAll
            (&this->m_framebuffers,
             (vector<sglr::rc::Framebuffer_*,_std::allocator<sglr::rc::Framebuffer_*>_> *)&local_28)
  ;
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteFramebuffer(this,(Framebuffer *)*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::Renderbuffer>::getAll
            (&this->m_renderbuffers,
             (vector<sglr::rc::Renderbuffer_*,_std::allocator<sglr::rc::Renderbuffer_*>_> *)
             &local_28);
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteRenderbuffer(this,(Renderbuffer *)*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::DataBuffer>::getAll(&this->m_buffers,&local_28);
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteBuffer(this,*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::getAll
            (&this->m_programs,
             (vector<sglr::rc::ShaderProgramObjectContainer_*,_std::allocator<sglr::rc::ShaderProgramObjectContainer_*>_>
              *)&local_28);
  ppDVar7 = local_28.
            super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      deleteProgramObject(this,(ShaderProgramObjectContainer *)*ppDVar7);
      ppDVar7 = ppDVar7 + 1;
    } while (ppDVar7 !=
             local_28.
             super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_28.super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<sglr::rc::DataBuffer_*,_std::allocator<sglr::rc::DataBuffer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pfVar2 = (this->m_fragmentDepths).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->m_fragmentDepths).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
  }
  pFVar3 = (this->m_fragmentBuffer).super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pFVar3 != (pointer)0x0) {
    operator_delete(pFVar3,(long)(this->m_fragmentBuffer).
                                 super__Vector_base<rr::Fragment,_std::allocator<rr::Fragment>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar3);
  }
  pGVar4 = (this->m_currentAttribs).
           super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pGVar4 != (pointer)0x0) {
    operator_delete(pGVar4,(long)(this->m_currentAttribs).
                                 super__Vector_base<rr::GenericVec4,_std::allocator<rr::GenericVec4>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar4);
  }
  (this->m_emptyTexCubeArray).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCubeArray_00b4f970;
  rc::TextureLevelArray::~TextureLevelArray(&(this->m_emptyTexCubeArray).m_levels);
  (this->m_emptyTex3D).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture3D_00b4f990;
  rc::TextureLevelArray::~TextureLevelArray(&(this->m_emptyTex3D).m_levels);
  (this->m_emptyTex2DArray).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture2DArray_00b4f950;
  rc::TextureLevelArray::~TextureLevelArray(&(this->m_emptyTex2DArray).m_levels);
  (this->m_emptyTexCube).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCube_00b4f930;
  lVar8 = 0x2890;
  do {
    rc::TextureLevelArray::~TextureLevelArray
              ((TextureLevelArray *)
               ((long)(this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.m_size.
                      m_data + lVar8 + -0x70));
    lVar8 = lVar8 + -0x540;
  } while (lVar8 != 0x910);
  (this->m_emptyTex2D).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture2D_00b4f910;
  rc::TextureLevelArray::~TextureLevelArray(&(this->m_emptyTex2D).m_levels);
  (this->m_emptyTex1D).super_Texture.super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__Texture1D_00b4f8f0;
  rc::TextureLevelArray::~TextureLevelArray(&(this->m_emptyTex1D).m_levels);
  std::
  vector<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
  ::~vector(&this->m_textureUnits);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*>_>_>
  ::~_Rb_tree(&(this->m_programs).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::VertexArray_*>_>_>
  ::~_Rb_tree(&(this->m_vertexArrays).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::DataBuffer_*>_>_>
  ::~_Rb_tree(&(this->m_buffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Renderbuffer_*>_>_>
  ::~_Rb_tree(&(this->m_renderbuffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Framebuffer_*>_>_>
  ::~_Rb_tree(&(this->m_framebuffers).m_objects._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_sglr::rc::Texture_*>,_std::_Select1st<std::pair<const_unsigned_int,_sglr::rc::Texture_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_sglr::rc::Texture_*>_>_>
  ::~_Rb_tree(&(this->m_textures).m_objects._M_t);
  (this->m_clientVertexArray).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__VertexArray_00b4fae8;
  pVVar5 = (this->m_clientVertexArray).m_arrays.
           super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5,(long)(this->m_clientVertexArray).m_arrays.
                                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar5);
  }
  pcVar6 = (this->m_limits).extensionStr._M_dataplus._M_p;
  paVar1 = &(this->m_limits).extensionStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != paVar1) {
    operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_limits).extensionList);
  return;
}

Assistant:

ReferenceContext::~ReferenceContext (void)
{
	// Destroy all objects -- verifies that ref counting works
	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
			deleteVertexArray(*i);

		DE_ASSERT(m_clientVertexArray.getRefCount() == 1);
	}

	{
		vector<Texture*> textures;
		m_textures.getAll(textures);
		for (vector<Texture*>::iterator i = textures.begin(); i != textures.end(); i++)
			deleteTexture(*i);
	}

	{
		vector<Framebuffer*> framebuffers;
		m_framebuffers.getAll(framebuffers);
		for (vector<Framebuffer*>::iterator i = framebuffers.begin(); i != framebuffers.end(); i++)
			deleteFramebuffer(*i);
	}

	{
		vector<Renderbuffer*> renderbuffers;
		m_renderbuffers.getAll(renderbuffers);
		for (vector<Renderbuffer*>::iterator i = renderbuffers.begin(); i != renderbuffers.end(); i++)
			deleteRenderbuffer(*i);
	}

	{
		vector<DataBuffer*> buffers;
		m_buffers.getAll(buffers);
		for (vector<DataBuffer*>::iterator i = buffers.begin(); i != buffers.end(); i++)
			deleteBuffer(*i);
	}

	{
		vector<ShaderProgramObjectContainer*> programs;
		m_programs.getAll(programs);
		for (vector<ShaderProgramObjectContainer*>::iterator i = programs.begin(); i != programs.end(); i++)
			deleteProgramObject(*i);
	}
}